

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void initialize_impute_calc<ImputedData<long,double>,PredictionData<float,long>>
               (ImputedData<long,_double> *imp,PredictionData<float,_long> *prediction_data,
               Imputer *imputer,size_t row)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  size_t *psVar2;
  pointer puVar3;
  size_t sVar4;
  long *plVar5;
  long *plVar6;
  int *piVar7;
  pointer pvVar8;
  unsigned_long uVar9;
  pointer pdVar10;
  float *pfVar11;
  pointer plVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  vector<double,_std::allocator<double>_> *this;
  pointer pdVar18;
  size_t col_1;
  value_type_conflict local_30;
  
  imp->n_missing_sp = 0;
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  if (prediction_data->numeric_data == (float *)0x0) {
    pfVar11 = prediction_data->Xr;
    if (pfVar11 == (float *)0x0) goto LAB_002ae90f;
    plVar12 = (imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish == plVar12) {
      std::vector<long,_std::allocator<long>_>::resize(&imp->missing_sp,imputer->ncols_numeric);
      pfVar11 = prediction_data->Xr;
      plVar12 = (imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    plVar5 = prediction_data->Xr_ind;
    plVar6 = prediction_data->Xr_indptr;
    for (lVar13 = plVar6[row]; lVar13 < plVar6[row + 1]; lVar13 = lVar13 + 1) {
      if (0x7f7fffff < (uint)ABS(pfVar11[lVar13])) {
        lVar14 = plVar5[lVar13];
        sVar4 = imp->n_missing_sp;
        imp->n_missing_sp = sVar4 + 1;
        plVar12[sVar4] = lVar14;
      }
    }
    pdVar18 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar18) {
      lVar13 = imp->n_missing_sp << 3;
      for (lVar14 = 0; lVar13 != lVar14; lVar14 = lVar14 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar14) = 0;
      }
      pdVar18 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar14 = 0; lVar13 != lVar14; lVar14 = lVar14 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar14) = 0;
      }
      goto LAB_002ae90f;
    }
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (&imp->sp_num_sum,imputer->ncols_numeric,&local_30);
    this = &imp->sp_num_weight;
  }
  else {
    pvVar1 = &imp->missing_num;
    if ((imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar1,imputer->ncols_numeric);
    }
    psVar2 = &imp->n_missing_num;
    pfVar11 = prediction_data->numeric_data;
    if (prediction_data->is_col_major == false) {
      puVar3 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar17 = 0; uVar15 = imputer->ncols_numeric, uVar17 < uVar15; uVar17 = uVar17 + 1) {
        if (0x7f7fffff < (*(uint *)((long)pfVar11 + uVar17 * 4 + uVar15 * row * 4) & 0x7fffffff)) {
          sVar4 = *psVar2;
          *psVar2 = sVar4 + 1;
          puVar3[sVar4] = uVar17;
        }
      }
    }
    else {
      puVar3 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar17 = 0; uVar15 = imputer->ncols_numeric, uVar17 < uVar15; uVar17 = uVar17 + 1) {
        if (0x7f7fffff < (uint)ABS(pfVar11[row + prediction_data->nrows * uVar17])) {
          sVar4 = *psVar2;
          *psVar2 = sVar4 + 1;
          puVar3[sVar4] = uVar17;
        }
      }
    }
    pdVar18 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar18) {
      sVar4 = *psVar2;
      for (lVar13 = 0; sVar4 << 3 != lVar13; lVar13 = lVar13 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar13) = 0;
      }
      pdVar18 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar13 = 0; sVar4 << 3 != lVar13; lVar13 = lVar13 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar13) = 0;
      }
      goto LAB_002ae90f;
    }
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize(&imp->num_sum,uVar15,&local_30);
    this = &imp->num_weight;
  }
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize(this,imputer->ncols_numeric,&local_30);
LAB_002ae90f:
  if (prediction_data->categ_data != (int *)0x0) {
    pvVar1 = &imp->missing_cat;
    if ((imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar1,imputer->ncols_categ);
    }
    piVar7 = prediction_data->categ_data;
    if (prediction_data->is_col_major == false) {
      puVar3 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar17 = 0; uVar15 = imputer->ncols_categ, uVar17 < uVar15; uVar17 = uVar17 + 1) {
        if (*(int *)((long)piVar7 + uVar17 * 4 + uVar15 * row * 4) < 0) {
          sVar4 = imp->n_missing_cat;
          imp->n_missing_cat = sVar4 + 1;
          puVar3[sVar4] = uVar17;
        }
      }
    }
    else {
      puVar3 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar17 = 0; uVar15 = imputer->ncols_categ, uVar17 < uVar15; uVar17 = uVar17 + 1) {
        if (piVar7[row + prediction_data->nrows * uVar17] < 0) {
          sVar4 = imp->n_missing_cat;
          imp->n_missing_cat = sVar4 + 1;
          puVar3[sVar4] = uVar17;
        }
      }
    }
    pdVar18 = (imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar18) {
      local_30 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(&imp->cat_weight,uVar15,&local_30);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&imp->cat_sum,imputer->ncols_categ);
      lVar13 = 0;
      for (uVar17 = 0; uVar17 < imputer->ncols_categ; uVar17 = uVar17 + 1) {
        local_30 = 0.0;
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((imp->cat_sum).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar13),
                   (long)(imputer->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17],&local_30);
        lVar13 = lVar13 + 0x18;
      }
    }
    else {
      sVar4 = imp->n_missing_cat;
      for (lVar13 = 0; sVar4 * 8 - lVar13 != 0; lVar13 = lVar13 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar13) = 0;
      }
      pvVar8 = (imp->cat_sum).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (sVar16 = 0; sVar16 != sVar4; sVar16 = sVar16 + 1) {
        uVar9 = puVar3[sVar16];
        pdVar10 = *(pointer *)
                   ((long)&pvVar8[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data + 8);
        for (pdVar18 = pvVar8[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar18 != pdVar10; pdVar18 = pdVar18 + 1)
        {
          *pdVar18 = 0.0;
        }
      }
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, PredictionData &prediction_data, Imputer &imputer, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (prediction_data.numeric_data != NULL)
    {
        if (!imp.missing_num.size())
            imp.missing_num.resize(imputer.ncols_numeric);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        if (!imp.num_sum.size())
        {
            imp.num_sum.resize(imputer.ncols_numeric,    0);
            imp.num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.num_sum.begin(),     imp.num_sum.begin()    + imp.n_missing_num,  0);
            std::fill(imp.num_weight.begin(),  imp.num_weight.begin() + imp.n_missing_num,  0);
        }
    }

    else if (prediction_data.Xr != NULL)
    {
        if (!imp.missing_sp.size())
            imp.missing_sp.resize(imputer.ncols_numeric);
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            if (is_na_or_inf(prediction_data.Xr[ix]))
                imp.missing_sp[imp.n_missing_sp++] = prediction_data.Xr_ind[ix];

        if (!imp.sp_num_sum.size())
        {
            imp.sp_num_sum.resize(imputer.ncols_numeric,    0);
            imp.sp_num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.sp_num_sum.begin(),     imp.sp_num_sum.begin()    + imp.n_missing_sp,  0);
            std::fill(imp.sp_num_weight.begin(),  imp.sp_num_weight.begin() + imp.n_missing_sp,  0);
        }
    }
    
    if (prediction_data.categ_data != NULL)
    {
        if (!imp.missing_cat.size())
            imp.missing_cat.resize(imputer.ncols_categ);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        if (!imp.cat_weight.size())
        {
            imp.cat_weight.resize(imputer.ncols_categ, 0);
            imp.cat_sum.resize(imputer.ncols_categ);
            for (size_t col = 0; col < imputer.ncols_categ; col++)
                imp.cat_sum[col].resize(imputer.ncat[col], 0);
        }

        else
        {
            std::fill(imp.cat_weight.begin(), imp.cat_weight.begin() + imp.n_missing_cat, 0);
            for (size_t col = 0; col < imp.n_missing_cat; col++)
                std::fill(imp.cat_sum[imp.missing_cat[col]].begin(),
                          imp.cat_sum[imp.missing_cat[col]].end(),
                          0);
        }
    }
}